

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O3

int ON_Intersect(ON_Arc *A0,ON_Arc *A1,ON_3dPoint *P0,ON_3dPoint *P1)

{
  ON_3dPoint *pOVar1;
  undefined1 uVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  ON_Arc *this;
  double dVar7;
  ON_3dVector *this_00;
  ON_3dVector *v;
  int iVar8;
  ulong uVar9;
  double *pdVar10;
  ON_3dPoint *P0_00;
  double dVar11;
  ON_Interval OVar12;
  double t_1;
  ON_3dPoint LittleEnd;
  double t;
  ON_3dPoint *P [2];
  ON_3dPoint CCX [2];
  double local_110;
  double local_108;
  undefined8 uStack_100;
  ON_3dPoint local_f0;
  ON_Arc *local_d8;
  ON_3dPoint local_d0;
  double local_b8;
  undefined4 uStack_b0;
  uint uStack_ac;
  double local_a8;
  double local_a0;
  ON_3dPoint *local_98;
  ON_Interval local_90;
  double local_80;
  ON_3dPoint *local_78 [2];
  ON_3dPoint local_68;
  ON_3dPoint local_50;
  
  P1->z = ON_3dPoint::UnsetPoint.z;
  dVar7 = ON_3dPoint::UnsetPoint.y;
  P1->x = ON_3dPoint::UnsetPoint.x;
  P1->y = dVar7;
  dVar11 = ON_3dPoint::UnsetPoint.y;
  dVar7 = ON_3dPoint::UnsetPoint.x;
  P0->z = ON_3dPoint::UnsetPoint.z;
  P0->x = dVar7;
  P0->y = dVar11;
  local_78[0] = P0;
  local_78[1] = P1;
  local_108 = ON_Circle::MaximumCoordinate(&A0->super_ON_Circle);
  dVar7 = ON_Circle::MaximumCoordinate(&A1->super_ON_Circle);
  dVar11 = local_108;
  if (local_108 <= dVar7) {
    dVar11 = dVar7;
  }
  local_108 = 2.3283064365386963e-10;
  if (2.3283064365386963e-10 <= dVar11 * 2.2737367544323206e-13) {
    local_108 = dVar11 * 2.2737367544323206e-13;
  }
  uStack_100 = 0;
  P0_00 = &local_68;
  uVar5 = ON_Intersect(&A0->super_ON_Circle,&A1->super_ON_Circle,P0_00,&local_50);
  local_d8 = A1;
  if ((int)uVar5 < 3) {
    if ((int)uVar5 < 1) {
      return 0;
    }
    uVar9 = (ulong)uVar5;
    iVar8 = 0;
    do {
      bVar3 = ON_Arc::ClosestPointTo(A0,P0_00,&local_d0.x);
      if (bVar3) {
        ON_Circle::PointAt(&local_f0,&A0->super_ON_Circle,local_d0.x);
        dVar7 = ON_3dPoint::DistanceTo(P0_00,&local_f0);
        if ((dVar7 < local_108) && (bVar3 = ON_Arc::ClosestPointTo(A1,P0_00,&local_d0.x), bVar3)) {
          ON_Circle::PointAt(&local_f0,&A1->super_ON_Circle,local_d0.x);
          dVar7 = ON_3dPoint::DistanceTo(P0_00,&local_f0);
          if (dVar7 < local_108) {
            lVar6 = (long)iVar8;
            iVar8 = iVar8 + 1;
            pOVar1 = local_78[lVar6];
            pOVar1->z = P0_00->z;
            dVar7 = P0_00->y;
            pOVar1->x = P0_00->x;
            pOVar1->y = dVar7;
          }
        }
      }
      P0_00 = P0_00 + 1;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
    return iVar8;
  }
  if (uVar5 != 3) {
    return 0;
  }
  local_98 = P1;
  OVar12 = ON_Arc::Domain(A0);
  local_f0.y = OVar12.m_t[1];
  local_f0.x = OVar12.m_t[0];
  dVar7 = ON_Interval::Length((ON_Interval *)&local_f0);
  OVar12 = ON_Arc::Domain(A1);
  local_d0.y = OVar12.m_t[1];
  local_d0.x = OVar12.m_t[0];
  dVar11 = ON_Interval::Length((ON_Interval *)&local_d0);
  this = A0;
  if (dVar11 < dVar7) {
    this = A1;
    A1 = A0;
  }
  OVar12 = ON_Arc::Domain(A1);
  local_90.m_t[1] = OVar12.m_t[1];
  local_90.m_t[0] = OVar12.m_t[0];
  uStack_ac = (uint)((ulong)uStack_100 >> 0x20) ^ 0x80000000;
  uStack_b0 = (undefined4)uStack_100;
  local_b8 = -local_108;
  dVar7 = ON_Circle::Radius(&A1->super_ON_Circle);
  bVar3 = ON_Interval::Expand(&local_90,local_b8 / dVar7);
  if (!bVar3) {
    OVar12 = ON_Arc::Domain(A1);
    local_f0.y = OVar12.m_t[1];
    local_f0.x = OVar12.m_t[0];
    dVar7 = ON_Interval::Mid((ON_Interval *)&local_f0);
    OVar12 = ON_Interval::Singleton(dVar7);
    local_90.m_t[1] = OVar12.m_t[1];
    local_90.m_t[0] = OVar12.m_t[0];
  }
  pdVar10 = &local_a8;
  bVar3 = true;
  do {
    if (bVar3) {
      ON_Arc::StartPoint(&local_f0,this);
    }
    else {
      ON_Arc::EndPoint(&local_f0,this);
    }
    bVar4 = ON_Arc::ClosestPointTo(A1,&local_f0,&local_110);
    if (bVar4) {
      iVar8 = ON_Interval::Clamp(&local_90,&local_110);
      if (iVar8 == 1) {
        ON_Arc::EndPoint(&local_d0,A1);
        dVar7 = ON_3dPoint::DistanceTo(&local_d0,&local_f0);
        if (local_108 <= dVar7) {
LAB_004ba594:
          dVar7 = -1.0;
        }
        else {
          dVar7 = 1.0;
        }
        *pdVar10 = dVar7;
      }
      else if (iVar8 == 0) {
        *pdVar10 = 0.5;
      }
      else if (iVar8 == -1) {
        ON_Arc::StartPoint(&local_d0,A1);
        dVar7 = ON_3dPoint::DistanceTo(&local_d0,&local_f0);
        if (local_108 <= dVar7) goto LAB_004ba594;
        *pdVar10 = 0.0;
      }
    }
    pdVar10 = &local_80;
    uVar2 = !bVar3;
    bVar3 = false;
    if ((bool)uVar2) {
      if ((local_a8 == 0.5) && (!NAN(local_a8))) {
        return 3;
      }
      if ((local_80 == 0.5) && (!NAN(local_80))) {
        return 3;
      }
      if ((((local_a8 == -1.0) && (!NAN(local_a8))) && (local_80 == -1.0)) && (!NAN(local_80))) {
        return 0;
      }
      if ((local_a8 != -1.0) || (NAN(local_a8))) {
        if ((local_80 == -1.0) && (!NAN(local_80))) {
          ON_Arc::StartPoint(&local_f0,this);
          P0->z = local_f0.z;
          P0->x = local_f0.x;
          P0->y = local_f0.y;
          return 1;
        }
        local_b8 = local_a8;
        local_a0 = local_80;
        this_00 = ON_Circle::Normal(&A0->super_ON_Circle);
        v = ON_Circle::Normal(&local_d8->super_ON_Circle);
        dVar7 = ON_3dVector::operator*(this_00,v);
        if ((local_b8 != local_a0) || (NAN(local_b8) || NAN(local_a0))) {
          if ((local_b8 != 1.0) != 0.0 < dVar7) {
            ON_Arc::StartPoint(&local_f0,this);
            P0->z = local_f0.z;
            P0->x = local_f0.x;
            P0->y = local_f0.y;
            ON_Arc::EndPoint(&local_f0,this);
            local_98->z = local_f0.z;
            local_98->x = local_f0.x;
            local_98->y = local_f0.y;
            return 2;
          }
          return 3;
        }
        ON_Arc::StartPoint(&local_f0,this);
        ON_Arc::EndPoint(&local_d0,this);
        dVar7 = ON_3dPoint::DistanceTo(&local_f0,&local_d0);
        if (local_108 <= dVar7) {
          return 3;
        }
        ON_Arc::StartPoint(&local_f0,this);
      }
      else {
        ON_Arc::EndPoint(&local_f0,this);
      }
      P0->z = local_f0.z;
      P0->x = local_f0.x;
      P0->y = local_f0.y;
      return 1;
    }
  } while( true );
}

Assistant:

int ON_Intersect(
  const ON_Arc& A0,
  const ON_Arc& A1,
  ON_3dPoint& P0,
  ON_3dPoint& P1)
{
  P0 = P1 = ON_3dPoint::UnsetPoint;
  ON_3dPoint* P[] = { &P0, &P1 };
  int xcnt = 0;

  double scale0 = A0.MaximumCoordinate();
  double abstol = A1.MaximumCoordinate();
  if (abstol < scale0)
    abstol = scale0;
  abstol *= ON_RELATIVE_TOLERANCE;
  if (abstol < ON_ZERO_TOLERANCE)
    abstol = ON_ZERO_TOLERANCE;


  ON_3dPoint CCX[2];
  int cxcnt = ON_Intersect(static_cast<const ON_Circle&>(A0), static_cast<const ON_Circle&>(A1), CCX[0], CCX[1]);
  if ( cxcnt < 3)
  {
    for (int i = 0; i < cxcnt; i++)
    {
      double t;
      if (A0.ClosestPointTo(CCX[i], &t))
      {
        if (CCX[i].DistanceTo(A0.PointAt(t)) < abstol)
        {
          if (A1.ClosestPointTo(CCX[i], &t))
          {
            if (CCX[i].DistanceTo(A1.PointAt(t)) < abstol)
              *P[xcnt++] = CCX[i];
          }
        }
      }
    }
  }
  else if (cxcnt == 3)
  {
    // circle doesn't degenerate to a point
    // order arcs by size
    const  ON_Arc* Size[] = { &A0, &A1 };     //Size[0]<=Size[1]
    if (A0.Domain().Length() > A1.Domain().Length())
    {
      Size[0] = &A1;
      Size[1] = &A0;
    }

    // Match ends of smaller to larger arc
    double LittleEndMatch[2];  // relative to Big ArcBig,  0-start, 1-end , .5 (interior),  -1 ( exterior)

    ON_Interval BigInterior = Size[1]->Domain();    // interior domain of big arc
    if (!BigInterior.Expand(-abstol / Size[1]->Radius()))         // circles are not degenerate
      BigInterior = ON_Interval::Singleton(Size[1]->Domain().Mid());
    
    for (int ei = 0; ei < 2; ei++)
    {
      double t;
      ON_3dPoint LittleEnd = ei ? Size[0]->EndPoint() : Size[0]->StartPoint();
      if (Size[1]->ClosestPointTo(LittleEnd, &t))
      {
        switch (BigInterior.Clamp(t))
        {
        case(-1):
          if (Size[1]->StartPoint().DistanceTo(LittleEnd) < abstol)
            LittleEndMatch[ei] = 0;   // start
          else
            LittleEndMatch[ei] = -1;  // exterior
          break;
        case(0):
          LittleEndMatch[ei] = .5;    // interior
          break;
        case(1):
          if (Size[1]->EndPoint().DistanceTo(LittleEnd) < abstol)
            LittleEndMatch[ei] = 1;       // end
          else
            LittleEndMatch[ei] = -1;     // exterior
          break;
        }
      }
    }

    if (LittleEndMatch[0] == .5 || LittleEndMatch[1] == .5)
      xcnt = 3;     // an interior match means an overlap
    else if (LittleEndMatch[0] == -1 && LittleEndMatch[1] == -1)
      xcnt = 0;     // both points exterior means  intersection is empty
    else if (LittleEndMatch[0] == -1)
      *P[xcnt++] = Size[0]->EndPoint();    // if start is exterior end must be an intersection point
    else if (LittleEndMatch[1] == -1)
      *P[xcnt++] = Size[0]->StartPoint();
    else
    {
      // Both endpoints match endpoints of Big
      // LittleEndMatch[ei] \in { 0, 1 }
      bool Orientation_agree = (A0.Normal() * A1.Normal() > 0);     // true if  the orientations agree
      if (LittleEndMatch[0] != LittleEndMatch[1])
      {
        if (Orientation_agree == (LittleEndMatch[0] == 1.0))
        {
          *P[xcnt++] = Size[0]->StartPoint();
          *P[xcnt++] = Size[0]->EndPoint();
        }
        else
          xcnt = 3;
      }
      else
      {
        // Degenerate cases
        if (Size[0]->StartPoint().DistanceTo(Size[0]->EndPoint()) < abstol)
          *P[xcnt++] = Size[0]->StartPoint();
        else
          xcnt = 3;
      }
    }
  }
  
  return xcnt;
}